

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O0

int __thiscall ncnn::Embed::load_model(Embed *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  undefined4 *local_260;
  int *local_258;
  long *local_240;
  void *local_218;
  int *local_210;
  undefined8 local_208;
  undefined4 local_200;
  long *local_1f8;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined8 local_1d8;
  void *local_1c0;
  int *local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  long *local_1a0;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined8 local_180;
  long *local_178;
  int local_164;
  void **local_160;
  void **local_150;
  undefined4 **local_140;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  void **local_120;
  void **local_118;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  void **local_100;
  void **local_f8;
  long *local_f0;
  long *local_e8;
  undefined8 local_e0;
  undefined4 **local_d8;
  long *local_d0;
  long *local_c8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_90;
  undefined4 local_8c;
  undefined4 **local_88;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  int local_50;
  undefined4 local_4c;
  void **local_48;
  void *local_10;
  void *local_8;
  
  local_178 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_1c0,in_RSI,*(undefined4 *)(in_RDI + 0xdc),0);
  ppvVar2 = (void **)(in_RDI + 0xe8);
  local_108 = &local_1c0;
  local_100 = ppvVar2;
  if (ppvVar2 != local_108) {
    if (local_1b8 != (int *)0x0) {
      local_10c = 1;
      LOCK();
      local_110 = *local_1b8;
      *local_1b8 = *local_1b8 + 1;
      UNLOCK();
    }
    local_b8 = ppvVar2;
    if (*(long *)(in_RDI + 0xf0) != 0) {
      piVar1 = *(int **)(in_RDI + 0xf0);
      local_bc = 0xffffffff;
      LOCK();
      local_c0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_c0 == 1) {
        if (*(long *)(in_RDI + 0x108) == 0) {
          local_8 = *ppvVar2;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))(*(long **)(in_RDI + 0x108),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x114) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0x11c) = 0;
    *(undefined4 *)(in_RDI + 0x120) = 0;
    *(undefined8 *)(in_RDI + 0x128) = 0;
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    *ppvVar2 = *local_108;
    *(void **)(in_RDI + 0xf0) = local_108[1];
    *(void **)(in_RDI + 0xf8) = local_108[2];
    *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_108 + 3);
    *(void **)(in_RDI + 0x108) = local_108[4];
    *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_108 + 5);
    *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_108 + 0x2c);
    *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_108 + 6);
    *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)((long)local_108 + 0x34);
    *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_108 + 7);
    *(void **)(in_RDI + 0x128) = local_108[8];
  }
  local_160 = &local_1c0;
  local_f8 = ppvVar2;
  local_48 = local_160;
  if (local_1b8 != (int *)0x0) {
    local_4c = 0xffffffff;
    LOCK();
    local_50 = *local_1b8;
    *local_1b8 = *local_1b8 + -1;
    UNLOCK();
    if (local_50 == 1) {
      if (local_1a0 == (long *)0x0) {
        if (local_1c0 != (void *)0x0) {
          free(local_1c0);
        }
      }
      else {
        (**(code **)(*local_1a0 + 0x18))(local_1a0,local_1c0);
      }
    }
  }
  local_1c0 = (void *)0x0;
  local_1b0 = 0;
  local_1a8 = 0;
  local_198 = 0;
  local_194 = 0;
  local_190 = 0;
  local_18c = 0;
  local_188 = 0;
  local_180 = 0;
  local_1b8 = (int *)0x0;
  local_e8 = (long *)(in_RDI + 0xe8);
  bVar3 = true;
  if (*local_e8 != 0) {
    bVar3 = *(long *)(in_RDI + 0x128) * (long)*(int *)(in_RDI + 0x120) == 0;
    local_d0 = local_e8;
  }
  if (bVar3) {
    local_164 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xd8) != 0) {
      (**(code **)(*local_178 + 0x10))(&local_218,local_178,*(undefined4 *)(in_RDI + 0xd0),1);
      ppvVar2 = (void **)(in_RDI + 0x130);
      local_128 = &local_218;
      local_120 = ppvVar2;
      if (ppvVar2 != local_128) {
        if (local_210 != (int *)0x0) {
          local_12c = 1;
          LOCK();
          local_130 = *local_210;
          *local_210 = *local_210 + 1;
          UNLOCK();
        }
        local_a8 = ppvVar2;
        if (*(long *)(in_RDI + 0x138) != 0) {
          piVar1 = *(int **)(in_RDI + 0x138);
          local_ac = 0xffffffff;
          LOCK();
          local_b0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_b0 == 1) {
            if (*(long *)(in_RDI + 0x150) == 0) {
              local_10 = *ppvVar2;
              if (local_10 != (void *)0x0) {
                free(local_10);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x140) = 0;
        *(undefined4 *)(in_RDI + 0x148) = 0;
        *(undefined4 *)(in_RDI + 0x158) = 0;
        *(undefined4 *)(in_RDI + 0x15c) = 0;
        *(undefined4 *)(in_RDI + 0x160) = 0;
        *(undefined4 *)(in_RDI + 0x164) = 0;
        *(undefined4 *)(in_RDI + 0x168) = 0;
        *(undefined8 *)(in_RDI + 0x170) = 0;
        *(undefined8 *)(in_RDI + 0x138) = 0;
        *ppvVar2 = *local_128;
        *(void **)(in_RDI + 0x138) = local_128[1];
        *(void **)(in_RDI + 0x140) = local_128[2];
        *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_128 + 3);
        *(void **)(in_RDI + 0x150) = local_128[4];
        *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_128 + 5);
        *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_128 + 0x2c);
        *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_128 + 6);
        *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)((long)local_128 + 0x34);
        *(undefined4 *)(in_RDI + 0x168) = *(undefined4 *)(local_128 + 7);
        *(void **)(in_RDI + 0x170) = local_128[8];
      }
      local_150 = &local_218;
      local_118 = ppvVar2;
      local_68 = local_150;
      if (local_210 != (int *)0x0) {
        local_6c = 0xffffffff;
        LOCK();
        local_70 = *local_210;
        *local_210 = *local_210 + -1;
        UNLOCK();
        if (local_70 == 1) {
          if (local_1f8 == (long *)0x0) {
            if (local_218 != (void *)0x0) {
              free(local_218);
            }
          }
          else {
            (**(code **)(*local_1f8 + 0x18))(local_1f8,local_218);
          }
        }
      }
      local_218 = (void *)0x0;
      local_208 = 0;
      local_200 = 0;
      local_1f0 = 0;
      local_1ec = 0;
      local_1e8 = 0;
      local_1e4 = 0;
      local_1e0 = 0;
      local_1d8 = 0;
      local_210 = (int *)0x0;
      local_f0 = (long *)(in_RDI + 0x130);
      bVar3 = true;
      if (*local_f0 != 0) {
        bVar3 = *(long *)(in_RDI + 0x170) * (long)*(int *)(in_RDI + 0x168) == 0;
        local_c8 = local_f0;
      }
      if (bVar3) {
        return -100;
      }
    }
    if (*(int *)(in_RDI + 0xe0) != 0) {
      (**(code **)(*local_178 + 0x10))(&local_260,local_178,1);
      local_d8 = &local_260;
      local_e0 = 0;
      *(undefined4 *)(in_RDI + 0x178) = *local_260;
      local_140 = &local_260;
      if (local_258 != (int *)0x0) {
        local_8c = 0xffffffff;
        LOCK();
        local_90 = *local_258;
        *local_258 = *local_258 + -1;
        UNLOCK();
        if (local_90 == 1) {
          local_88 = local_140;
          if (local_240 == (long *)0x0) {
            if (local_260 != (undefined4 *)0x0) {
              free(local_260);
            }
          }
          else {
            (**(code **)(*local_240 + 0x18))(local_240,local_260);
          }
        }
      }
    }
    local_164 = 0;
  }
  return local_164;
}

Assistant:

int Embed::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
    }
#endif // NCNN_INT8

    return 0;
}